

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemodel.cpp
# Opt level: O0

char * __thiscall FSSResourceModel::index(FSSResourceModel *this,char *__s,int __c)

{
  bool bVar1;
  quintptr qVar2;
  int in_ECX;
  QModelIndex *in_R8;
  QModelIndex *parent_local;
  int column_local;
  int row_local;
  FSSResourceModel *this_local;
  
  bVar1 = QModelIndex::isValid(in_R8);
  if (bVar1) {
    qVar2 = QModelIndex::internalId(in_R8);
    QAbstractItemModel::createIndex
              ((QModelIndex *)this,(QAbstractItemModel *)__s,__c,in_ECX,
               (long)((__c + 1) * 0x10000) | qVar2 & 0xff);
  }
  else {
    QAbstractItemModel::createIndex
              ((QModelIndex *)this,(QAbstractItemModel *)__s,__c,in_ECX,(long)(__c + 1));
  }
  return (char *)this;
}

Assistant:

QModelIndex
FSSResourceModel::index(int row, int column,
                        const QModelIndex &parent) const {
  if (parent.isValid()) {
    return createIndex(row, column,
                       ((row+1) << 16) |
                       (parent.internalId() & 0xFF));
  } else {
    return createIndex(row, column, row+1);
  }
}